

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int wally_tx_to_hex(wally_tx *tx,uint32_t flags,char **output)

{
  int iVar1;
  size_t local_30;
  size_t is_elements;
  char **output_local;
  wally_tx *pwStack_18;
  uint32_t flags_local;
  wally_tx *tx_local;
  
  local_30 = 0;
  is_elements = (size_t)output;
  output_local._4_4_ = flags;
  pwStack_18 = tx;
  iVar1 = wally_tx_is_elements(tx,&local_30);
  if (iVar1 == 0) {
    tx_local._4_4_ =
         tx_to_hex_or_txid(pwStack_18,output_local._4_4_,(char **)is_elements,(uchar *)0x0,0,
                           local_30 != 0);
  }
  else {
    tx_local._4_4_ = -2;
  }
  return tx_local._4_4_;
}

Assistant:

int wally_tx_to_hex(const struct wally_tx *tx, uint32_t flags,
                    char **output)
{
    size_t is_elements = 0;

#ifdef BUILD_ELEMENTS
    if (wally_tx_is_elements(tx, &is_elements) != WALLY_OK)
        return WALLY_EINVAL;
#endif
    return tx_to_hex_or_txid(tx, flags, output, NULL, 0, is_elements);
}